

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> __thiscall
dg::vr::ValueRelations::get(ValueRelations *this,size_t id)

{
  Bucket *pBVar1;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar2;
  
  pBVar1 = RelationsGraph<dg::vr::ValueRelations>::getBorderB(&this->graph,id);
  if (pBVar1 == (Bucket *)0x0) {
    pBVar1 = newBorderBucket(this,id);
  }
  pVar2._8_8_ = 0;
  pVar2.first._M_data = pBVar1;
  return pVar2;
}

Assistant:

std::pair<ValueRelations::BRef, bool> ValueRelations::get(size_t id) {
    HandlePtr mH = getBorderH(id);
    return {mH ? *mH : newBorderBucket(id), false};
}